

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::updateSubtreeHeaders
          (btQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  btBvhSubtreeInfo *pbVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  btBvhSubtreeInfo *pbVar11;
  long lVar12;
  btQuantizedBvhNode *pbVar13;
  btQuantizedBvhNode *pbVar14;
  int iVar15;
  
  pbVar14 = (this->m_quantizedContiguousNodes).m_data;
  uVar3 = -pbVar14[leftChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar14[leftChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar3 = 1;
  }
  uVar5 = -pbVar14[rightChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar14[rightChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar5 = 1;
  }
  if (uVar3 < 0x81) {
    pbVar13 = pbVar14 + leftChildNodexIndex;
    uVar10 = (this->m_SubtreeHeaders).m_size;
    uVar9 = uVar10;
    if (uVar10 == (this->m_SubtreeHeaders).m_capacity) {
      iVar15 = 1;
      if (uVar10 != 0) {
        iVar15 = uVar10 * 2;
      }
      if ((int)uVar10 < iVar15) {
        if (iVar15 == 0) {
          pbVar11 = (btBvhSubtreeInfo *)0x0;
        }
        else {
          pbVar11 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)iVar15 << 5,0x10);
          uVar9 = (this->m_SubtreeHeaders).m_size;
        }
        if (0 < (int)uVar9) {
          lVar12 = 0;
          do {
            pbVar4 = (this->m_SubtreeHeaders).m_data;
            puVar1 = (undefined8 *)((long)pbVar4->m_quantizedAabbMin + lVar12);
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)((long)pbVar4->m_padding + lVar12 + -4);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pbVar11->m_padding + lVar12 + -4);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pbVar11->m_quantizedAabbMin + lVar12);
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
            lVar12 = lVar12 + 0x20;
          } while ((ulong)uVar9 << 5 != lVar12);
        }
        pbVar4 = (this->m_SubtreeHeaders).m_data;
        if ((pbVar4 != (btBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true))
        {
          btAlignedFreeInternal(pbVar4);
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pbVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar15;
        uVar9 = (this->m_SubtreeHeaders).m_size;
      }
    }
    (this->m_SubtreeHeaders).m_size = uVar9 + 1;
    pbVar11 = (this->m_SubtreeHeaders).m_data;
    pbVar11[(int)uVar10].m_quantizedAabbMin[0] = pbVar13->m_quantizedAabbMin[0];
    pbVar11[(int)uVar10].m_quantizedAabbMin[1] = pbVar13->m_quantizedAabbMin[1];
    pbVar11[(int)uVar10].m_quantizedAabbMin[2] = pbVar13->m_quantizedAabbMin[2];
    pbVar11[(int)uVar10].m_quantizedAabbMax[0] = pbVar13->m_quantizedAabbMax[0];
    pbVar11[(int)uVar10].m_quantizedAabbMax[1] = pbVar13->m_quantizedAabbMax[1];
    pbVar11[(int)uVar10].m_quantizedAabbMax[2] = pbVar13->m_quantizedAabbMax[2];
    pbVar11[(int)uVar10].m_rootNodeIndex = leftChildNodexIndex;
    pbVar11[(int)uVar10].m_subtreeSize = uVar3;
  }
  if ((int)uVar5 < 0x81) {
    pbVar14 = pbVar14 + rightChildNodexIndex;
    uVar3 = (this->m_SubtreeHeaders).m_size;
    uVar10 = uVar3;
    if (uVar3 == (this->m_SubtreeHeaders).m_capacity) {
      iVar15 = 1;
      if (uVar3 != 0) {
        iVar15 = uVar3 * 2;
      }
      if ((int)uVar3 < iVar15) {
        if (iVar15 == 0) {
          pbVar11 = (btBvhSubtreeInfo *)0x0;
        }
        else {
          pbVar11 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)iVar15 << 5,0x10);
          uVar10 = (this->m_SubtreeHeaders).m_size;
        }
        if (0 < (int)uVar10) {
          lVar12 = 0;
          do {
            pbVar4 = (this->m_SubtreeHeaders).m_data;
            puVar1 = (undefined8 *)((long)pbVar4->m_quantizedAabbMin + lVar12);
            uVar6 = *puVar1;
            uVar7 = puVar1[1];
            puVar1 = (undefined8 *)((long)pbVar4->m_padding + lVar12 + -4);
            uVar8 = puVar1[1];
            puVar2 = (undefined8 *)((long)pbVar11->m_padding + lVar12 + -4);
            *puVar2 = *puVar1;
            puVar2[1] = uVar8;
            puVar1 = (undefined8 *)((long)pbVar11->m_quantizedAabbMin + lVar12);
            *puVar1 = uVar6;
            puVar1[1] = uVar7;
            lVar12 = lVar12 + 0x20;
          } while ((ulong)uVar10 << 5 != lVar12);
        }
        pbVar4 = (this->m_SubtreeHeaders).m_data;
        if ((pbVar4 != (btBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true))
        {
          btAlignedFreeInternal(pbVar4);
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pbVar11;
        (this->m_SubtreeHeaders).m_capacity = iVar15;
        uVar10 = (this->m_SubtreeHeaders).m_size;
      }
    }
    (this->m_SubtreeHeaders).m_size = uVar10 + 1;
    pbVar11 = (this->m_SubtreeHeaders).m_data;
    pbVar11[(int)uVar3].m_quantizedAabbMin[0] = pbVar14->m_quantizedAabbMin[0];
    pbVar11[(int)uVar3].m_quantizedAabbMin[1] = pbVar14->m_quantizedAabbMin[1];
    pbVar11[(int)uVar3].m_quantizedAabbMin[2] = pbVar14->m_quantizedAabbMin[2];
    pbVar11[(int)uVar3].m_quantizedAabbMax[0] = pbVar14->m_quantizedAabbMax[0];
    pbVar11[(int)uVar3].m_quantizedAabbMax[1] = pbVar14->m_quantizedAabbMax[1];
    pbVar11[(int)uVar3].m_quantizedAabbMax[2] = pbVar14->m_quantizedAabbMax[2];
    pbVar11[(int)uVar3].m_rootNodeIndex = rightChildNodexIndex;
    pbVar11[(int)uVar3].m_subtreeSize = uVar5;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  return;
}

Assistant:

void	btQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex,int rightChildNodexIndex)
{
	btAssert(m_useQuantization);

	btQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes =  leftSubTreeSize * static_cast<int>(sizeof(btQuantizedBvhNode));
	
	btQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes =  rightSubTreeSize *  static_cast<int>(sizeof(btQuantizedBvhNode));

	if(leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if(rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}